

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O0

void __thiscall
pbrt::BufferCache<pbrt::Point2<float>_>::Clear(BufferCache<pbrt::Point2<float>_> *this)

{
  bool bVar1;
  lock_guard<std::mutex> *in_RDI;
  Buffer iter;
  iterator __end0;
  iterator __begin0;
  unordered_set<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point2<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>_>
  *__range2;
  lock_guard<std::mutex> lock;
  unordered_set<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point2<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>_>
  *in_stack_ffffffffffffffa8;
  _Node_iterator_base<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_true> local_28;
  _Node_iterator_base<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_true> local_20;
  lock_guard<std::mutex> *local_18;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,(mutex_type *)in_stack_ffffffffffffffa8);
  local_18 = in_RDI + 6;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point2<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point2<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::__detail::_Node_iterator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_true,_true>::
    operator*((_Node_iterator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_true,_true> *)
              0x4962bc);
    pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<pbrt::Point2<float>>
              ((polymorphic_allocator<std::byte> *)in_RDI,(Point2<float> *)in_stack_ffffffffffffffa8
               ,0x4962da);
    std::__detail::_Node_iterator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_true,_true>::
    operator++((_Node_iterator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_true,_true> *)in_RDI
              );
  }
  std::
  unordered_set<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point2<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>_>
  ::clear((unordered_set<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point2<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>_>
           *)0x496312);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x49631c);
  return;
}

Assistant:

void Clear() {
        std::lock_guard<std::mutex> lock(mutex);
        for (auto iter : cache)
            alloc.deallocate_object(const_cast<T *>(iter.ptr), iter.size);
        cache.clear();
    }